

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectExpander(Walker *pWalker,Select *p)

{
  i16 iVar1;
  Parse *pParse_00;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Table *pTVar8;
  Select *pSVar9;
  char *pcVar10;
  Vdbe *pVVar11;
  long *in_RSI;
  undefined8 *in_RDI;
  ExprList_item *pX;
  Expr *pLeft;
  Token sColname;
  char *zToFree;
  char *zColname;
  char *zName;
  int iDb;
  char *zSchemaName;
  char *zTabName;
  Select *pSub;
  Table *pTab_1;
  char *zTName;
  int tableSeen;
  int longNames;
  int flags;
  ExprList *pNew;
  ExprList_item *a;
  i16 nCol;
  Select *pSel;
  Table *pTab;
  u32 elistFlags;
  u16 selFlags;
  Expr *pExpr;
  Expr *pRight;
  Expr *pE;
  sqlite3 *db;
  SrcList_item *pFrom;
  ExprList *pEList;
  SrcList *pTabList;
  int k;
  int j;
  int i;
  Parse *pParse;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  sqlite3 *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  u32 in_stack_fffffffffffffeec;
  uint uVar12;
  sqlite3 *in_stack_fffffffffffffef0;
  Parse *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  Select *in_stack_ffffffffffffff08;
  sqlite3 *in_stack_ffffffffffffff10;
  Parse *in_stack_ffffffffffffff18;
  sqlite3 *local_d0;
  char *local_c8;
  Select *in_stack_ffffffffffffff40;
  long lVar13;
  Parse *in_stack_ffffffffffffff48;
  undefined8 *puVar14;
  SrcList_item *in_stack_ffffffffffffff50;
  char *zLeft;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  ExprList *local_98;
  uint local_70;
  sqlite3 *db_00;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  pParse_00 = (Parse *)*in_RDI;
  db_00 = pParse_00->db;
  uVar12 = *(uint *)((long)in_RSI + 0xc);
  local_70 = 0;
  *(uint *)((long)in_RSI + 0xc) = *(uint *)((long)in_RSI + 0xc) | 0x40;
  if (db_00->mallocFailed == '\0') {
    if ((uVar12 & 0x40) == 0) {
      piVar2 = (int *)in_RSI[5];
      piVar17 = (int *)*in_RSI;
      sqlite3WithPush(pParse_00,(With *)in_RSI[0xd],'\0');
      sqlite3SrcListAssignCursors
                ((Parse *)in_stack_fffffffffffffef0,
                 (SrcList *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      piVar15 = piVar2 + 2;
      for (local_24 = 0; local_24 < *piVar2; local_24 = local_24 + 1) {
        if ((*(byte *)((long)piVar15 + 0x3d) >> 5 & 1) == 0) {
          iVar6 = withExpand((Walker *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                             ,in_stack_ffffffffffffff50);
          if (iVar6 != 0) {
            return 2;
          }
          if (*(long *)(piVar15 + 8) == 0) {
            if (*(long *)(piVar15 + 4) == 0) {
              iVar6 = sqlite3WalkSelect((Walker *)
                                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ),(Select *)in_stack_fffffffffffffee0);
              if (iVar6 != 0) {
                return 2;
              }
              iVar6 = sqlite3ExpandSubquery
                                ((Parse *)CONCAT44(in_stack_fffffffffffffeec,
                                                   in_stack_fffffffffffffee8),
                                 (SrcList_item *)in_stack_fffffffffffffee0);
              if (iVar6 != 0) {
                return 2;
              }
            }
            else {
              pTVar8 = sqlite3LocateTableItem
                                 ((Parse *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                  (SrcList_item *)in_stack_fffffffffffffee0);
              *(Table **)(piVar15 + 8) = pTVar8;
              if (pTVar8 == (Table *)0x0) {
                return 2;
              }
              if (0xfffe < pTVar8->nTabRef) {
                sqlite3ErrorMsg(pParse_00,"too many references to \"%s\": max 65535",pTVar8->zName);
                piVar15[8] = 0;
                piVar15[9] = 0;
                return 2;
              }
              pTVar8->nTabRef = pTVar8->nTabRef + 1;
              if ((pTVar8->nModuleArg == 0) &&
                 (iVar6 = cannotBeFunction((Parse *)CONCAT44(in_stack_fffffffffffffedc,
                                                             in_stack_fffffffffffffed8),
                                           (SrcList_item *)0x1ab81d), iVar6 != 0)) {
                return 2;
              }
              if ((pTVar8->nModuleArg != 0) || (pTVar8->pSelect != (Select *)0x0)) {
                iVar6 = sqlite3ViewGetColumnNames
                                  (in_stack_ffffffffffffff18,(Table *)in_stack_ffffffffffffff10);
                if (iVar6 != 0) {
                  return 2;
                }
                pSVar9 = sqlite3SelectDup(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                                          in_stack_ffffffffffffff04);
                *(Select **)(piVar15 + 10) = pSVar9;
                iVar1 = pTVar8->nCol;
                pTVar8->nCol = -1;
                sqlite3WalkSelect((Walker *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                  (Select *)in_stack_fffffffffffffee0);
                pTVar8->nCol = iVar1;
              }
            }
          }
          iVar6 = sqlite3IndexedByLookup
                            (in_stack_fffffffffffffef8,(SrcList_item *)in_stack_fffffffffffffef0);
          if (iVar6 != 0) {
            return 2;
          }
        }
        piVar15 = piVar15 + 0x1c;
      }
      if ((db_00->mallocFailed == '\0') &&
         (iVar6 = sqliteProcessJoin(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40), iVar6 == 0
         )) {
        local_2c = 0;
        while (((local_2c < *piVar17 &&
                (pcVar3 = *(char **)(piVar17 + (long)local_2c * 8 + 2), *pcVar3 != -0x58)) &&
               ((*pcVar3 != -0x7e || (**(char **)(pcVar3 + 0x18) != -0x58))))) {
          local_70 = *(uint *)(pcVar3 + 4) | local_70;
          local_2c = local_2c + 1;
        }
        if (local_2c < *piVar17) {
          local_98 = (ExprList *)0x0;
          uVar4 = pParse_00->db->flags;
          uVar12 = in_stack_fffffffffffffeec & 0xffffff;
          if ((uVar4 & 4) != 0) {
            uVar12 = CONCAT13((uVar4 & 0x40) == 0,(int3)in_stack_fffffffffffffeec);
          }
          uVar5 = uVar12 >> 0x18;
          piVar15 = piVar17;
          for (local_2c = 0; local_2c < *piVar15; local_2c = local_2c + 1) {
            pcVar3 = *(char **)(piVar17 + (long)local_2c * 8 + 2);
            local_70 = *(uint *)(pcVar3 + 4) | local_70;
            if ((*pcVar3 == -0x58) || ((*pcVar3 == -0x7e && (**(char **)(pcVar3 + 0x18) == -0x58))))
            {
              iVar6 = 0;
              zLeft = (char *)0x0;
              if (*pcVar3 == -0x7e) {
                zLeft = *(char **)(*(long *)(pcVar3 + 0x10) + 8);
              }
              piVar16 = piVar2 + 2;
              for (local_24 = 0; local_24 < *piVar2; local_24 = local_24 + 1) {
                puVar14 = *(undefined8 **)(piVar16 + 8);
                lVar13 = *(long *)(piVar16 + 10);
                local_c8 = *(char **)(piVar16 + 6);
                local_d0 = (sqlite3 *)0x0;
                if (local_c8 == (char *)0x0) {
                  local_c8 = (char *)*puVar14;
                }
                if (db_00->mallocFailed != '\0') break;
                if ((lVar13 == 0) || ((*(uint *)(lVar13 + 0xc) & 0x800) == 0)) {
                  lVar13 = 0;
                  if ((zLeft == (char *)0x0) || (iVar7 = sqlite3StrICmp(zLeft,local_c8), iVar7 == 0)
                     ) {
                    iVar7 = sqlite3SchemaToIndex(db_00,(Schema *)puVar14[0xe]);
                    if (iVar7 < 0) {
                      in_stack_fffffffffffffee0 = (sqlite3 *)0x1e70fe;
                      local_d0 = in_stack_fffffffffffffee0;
                    }
                    else {
                      in_stack_fffffffffffffee0 = (sqlite3 *)db_00->aDb[iVar7].zDbSName;
                      local_d0 = in_stack_fffffffffffffee0;
                    }
                    goto LAB_001abe18;
                  }
                }
                else {
LAB_001abe18:
                  for (local_28 = 0; local_28 < *(short *)((long)puVar14 + 0x46);
                      local_28 = local_28 + 1) {
                    pcVar3 = *(char **)(puVar14[1] + (long)local_28 * 0x20);
                    if (((((zLeft == (char *)0x0) || (lVar13 == 0)) ||
                         (iVar7 = sqlite3MatchSpanName
                                            ((char *)in_stack_fffffffffffffef8,
                                             (char *)in_stack_fffffffffffffef0,
                                             (char *)CONCAT44(uVar12,in_stack_fffffffffffffee8),
                                             (char *)in_stack_fffffffffffffee0), iVar7 != 0)) &&
                        (((*(uint *)((long)in_RSI + 0xc) & 0x20000) != 0 ||
                         ((*(byte *)(puVar14[1] + (long)local_28 * 0x20 + 0x1b) & 2) == 0)))) &&
                       (((iVar6 = 1, local_24 < 1 || (zLeft != (char *)0x0)) ||
                        ((((*(byte *)(piVar16 + 0xf) & 4) == 0 ||
                          (iVar7 = tableAndColumnIndex((SrcList *)in_stack_fffffffffffffef8,
                                                       (int)((ulong)in_stack_fffffffffffffef0 >>
                                                            0x20),
                                                       (char *)CONCAT44(uVar12,
                                                  in_stack_fffffffffffffee8),
                                                  (int *)in_stack_fffffffffffffee0,
                                                  (int *)CONCAT44(in_stack_fffffffffffffedc,
                                                                  in_stack_fffffffffffffed8)),
                          iVar7 == 0)) &&
                         (iVar7 = sqlite3IdListIndex((IdList *)
                                                     CONCAT44(uVar12,in_stack_fffffffffffffee8),
                                                     (char *)in_stack_fffffffffffffee0), iVar7 < 0))
                        )))) {
                      sqlite3Expr(in_stack_fffffffffffffef0,uVar12,(char *)in_stack_fffffffffffffee0
                                 );
                      pcVar10 = pcVar3;
                      if ((uVar5 != 0) || (1 < *piVar2)) {
                        in_stack_fffffffffffffef8 =
                             (Parse *)sqlite3Expr(in_stack_fffffffffffffef0,uVar12,
                                                  (char *)in_stack_fffffffffffffee0);
                        sqlite3PExpr((Parse *)in_stack_fffffffffffffef0,uVar12,
                                     (Expr *)in_stack_fffffffffffffee0,
                                     (Expr *)CONCAT44(in_stack_fffffffffffffedc,
                                                      in_stack_fffffffffffffed8));
                        if (local_d0 != (sqlite3 *)0x0) {
                          in_stack_fffffffffffffef8 =
                               (Parse *)sqlite3Expr(in_stack_fffffffffffffef0,uVar12,
                                                    (char *)in_stack_fffffffffffffee0);
                          sqlite3PExpr((Parse *)in_stack_fffffffffffffef0,uVar12,
                                       (Expr *)in_stack_fffffffffffffee0,
                                       (Expr *)CONCAT44(in_stack_fffffffffffffedc,
                                                        in_stack_fffffffffffffed8));
                        }
                        if (uVar5 != 0) {
                          pcVar10 = sqlite3MPrintf(db_00,"%s.%s",local_c8,pcVar3);
                        }
                      }
                      local_98 = sqlite3ExprListAppend
                                           (in_stack_fffffffffffffef8,
                                            (ExprList *)in_stack_fffffffffffffef0,
                                            (Expr *)CONCAT44(uVar12,in_stack_fffffffffffffee8));
                      sqlite3TokenInit((Token *)in_stack_fffffffffffffee0,
                                       (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                        in_stack_fffffffffffffed8));
                      sqlite3ExprListSetName
                                ((Parse *)in_stack_fffffffffffffef0,
                                 (ExprList *)CONCAT44(uVar12,in_stack_fffffffffffffee8),
                                 (Token *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
                      if ((local_98 != (ExprList *)0x0) &&
                         ((*(uint *)((long)in_RSI + 0xc) & 0x800) != 0)) {
                        in_stack_fffffffffffffef0 =
                             (sqlite3 *)(local_98->a + (local_98->nExpr + -1));
                        if (lVar13 == 0) {
                          pVVar11 = (Vdbe *)sqlite3MPrintf(db_00,"%s.%s.%s",local_d0,local_c8,
                                                           pcVar10);
                          in_stack_fffffffffffffef0->pDfltColl = (CollSeq *)pVVar11;
                        }
                        else {
                          pVVar11 = (Vdbe *)sqlite3DbStrDup((sqlite3 *)
                                                            CONCAT44(uVar12,
                                                  in_stack_fffffffffffffee8),
                                                  (char *)in_stack_fffffffffffffee0);
                          in_stack_fffffffffffffef0->pDfltColl = (CollSeq *)pVVar11;
                        }
                        *(byte *)((long)&in_stack_fffffffffffffef0->mutex + 1) =
                             *(byte *)((long)&in_stack_fffffffffffffef0->mutex + 1) & 0xfd | 2;
                      }
                      sqlite3DbFree(in_stack_fffffffffffffee0,
                                    (void *)CONCAT44(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8));
                    }
                  }
                }
                piVar16 = piVar16 + 0x1c;
              }
              if (iVar6 == 0) {
                if (zLeft == (char *)0x0) {
                  sqlite3ErrorMsg(pParse_00,"no tables specified");
                }
                else {
                  sqlite3ErrorMsg(pParse_00,"no such table: %s",zLeft);
                }
              }
            }
            else {
              local_98 = sqlite3ExprListAppend
                                   (in_stack_fffffffffffffef8,(ExprList *)in_stack_fffffffffffffef0,
                                    (Expr *)CONCAT44(uVar12,in_stack_fffffffffffffee8));
              if (local_98 != (ExprList *)0x0) {
                local_98->a[local_98->nExpr + -1].zName =
                     *(char **)(piVar17 + (long)local_2c * 8 + 4);
                local_98->a[local_98->nExpr + -1].zSpan =
                     *(char **)(piVar17 + (long)local_2c * 8 + 6);
                (piVar17 + (long)local_2c * 8 + 4)[0] = 0;
                (piVar17 + (long)local_2c * 8 + 4)[1] = 0;
                (piVar17 + (long)local_2c * 8 + 6)[0] = 0;
                (piVar17 + (long)local_2c * 8 + 6)[1] = 0;
              }
              (piVar17 + (long)local_2c * 8 + 2)[0] = 0;
              (piVar17 + (long)local_2c * 8 + 2)[1] = 0;
            }
          }
          sqlite3ExprListDelete
                    (in_stack_fffffffffffffee0,
                     (ExprList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          *in_RSI = (long)local_98;
        }
        if (*in_RSI != 0) {
          if (db_00->aLimit[2] < *(int *)*in_RSI) {
            sqlite3ErrorMsg(pParse_00,"too many columns in result set");
            return 2;
          }
          if ((local_70 & 0x200004) != 0) {
            *(uint *)((long)in_RSI + 0xc) = *(uint *)((long)in_RSI + 0xc) | 0x40000;
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = 2;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
  return WRC_Continue;
}